

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMerFactory.hpp
# Opt level: O2

void __thiscall
CStringKMerFactory128::create_kmers
          (CStringKMerFactory128 *this,
          vector<unsigned___int128,_std::allocator<unsigned___int128>_> *mers,char *s)

{
  __uint128_t *rkmer;
  __uint128_t *fkmer;
  ulong *puVar1;
  ulong uVar2;
  __uint128_t *__args;
  
  rkmer = &(this->super_KMerFactory128).fkmer;
  fkmer = &(this->super_KMerFactory128).rkmer;
  *(undefined8 *)((long)&(this->super_KMerFactory128).fkmer + 8) = 0;
  *(undefined8 *)&(this->super_KMerFactory128).rkmer = 0;
  (this->super_KMerFactory128).last_unknown = 0;
  *(undefined8 *)&(this->super_KMerFactory128).fkmer = 0;
  *(undefined8 *)((long)&(this->super_KMerFactory128).rkmer + 8) = 0;
  for (; *s != '\0'; s = (char *)((uchar *)s + 1)) {
    KMerFactory128::fillKBuf
              (&this->super_KMerFactory128,*s,rkmer,fkmer,&(this->super_KMerFactory128).last_unknown
              );
    if ((long)(ulong)(this->super_KMerFactory128).K <= (this->super_KMerFactory128).last_unknown) {
      uVar2 = *(ulong *)((long)&(this->super_KMerFactory128).rkmer + 8);
      puVar1 = (ulong *)((long)&(this->super_KMerFactory128).fkmer + 8);
      __args = fkmer;
      if (*puVar1 <= uVar2 && (ulong)((ulong)*fkmer < (ulong)*rkmer) <= uVar2 - *puVar1) {
        __args = rkmer;
      }
      std::vector<unsigned__int128,std::allocator<unsigned__int128>>::
      emplace_back<unsigned__int128&>
                ((vector<unsigned__int128,std::allocator<unsigned__int128>> *)mers,__args);
    }
  }
  return;
}

Assistant:

const void create_kmers(std::vector<__uint128_t> &mers, const char * s) {
        fkmer=0;
        rkmer=0;
        last_unknown=0;
        uint64_t p(0);
        while (s[p]!='\0') {
            //fkmer: grows from the right (LSB)
            //rkmer: grows from the left (MSB)
            fillKBuf(s[p], fkmer, rkmer, last_unknown);
            p++;
            if (last_unknown >= K) {
                if (fkmer <= rkmer) {
                    // Is fwd
                    mers.emplace_back(fkmer);
                } else {
                    // Is bwd
                    mers.emplace_back(rkmer);
                }
            }
        }
    }